

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void selectInnerLoop(Parse *pParse,Select *p,int srcTab,SortCtx *pSort,DistinctCtx *pDistinct,
                    SelectDest *pDest,int iContinue,int iBreak)

{
  undefined4 uVar1;
  uint regData;
  uint uVar2;
  int iVar3;
  int iVar4;
  long *in_RCX;
  Parse *pParse_00;
  int in_EDX;
  long in_RSI;
  Parse *in_RDI;
  long in_R8;
  Parse *in_R9;
  long in_FS_OFFSET;
  ExprList *pSO;
  int addrTest;
  int r3;
  int r2_1;
  int r1_4;
  int nKey;
  int r1_3;
  int r1_2;
  int i2;
  int r2;
  int addr;
  int r1_1;
  int r1;
  int iTab;
  int eType;
  int j;
  ExprList *pEList;
  u8 ecelFlags;
  int regOrig;
  int regResult;
  int nPrefixReg;
  int nResultCol;
  int iParm;
  int eDest;
  int hasDistinct;
  int i;
  Vdbe *v;
  RowLoadInfo sRowLoadInfo;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  Parse *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  uint eTnctType;
  Parse *in_stack_ffffffffffffff40;
  int *piVar5;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff64;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  byte local_69;
  int local_60;
  uint uVar6;
  int iVar7;
  int iVar8;
  Vdbe *p_00;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  p_00 = in_RDI->pVdbe;
  iVar7 = -0x55555556;
  regData = (uint)*(byte *)&in_R9->db;
  iVar4 = *(int *)((long)&in_R9->db + 4);
  local_60 = 0;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  if (in_R8 == 0) {
    eTnctType = 0;
  }
  else {
    eTnctType = (uint)*(byte *)(in_R8 + 1);
  }
  if ((in_RCX != (long *)0x0) && (*in_RCX == 0)) {
    in_RCX = (long *)0x0;
  }
  uVar6 = eTnctType;
  if ((in_RCX == (long *)0x0) && (eTnctType == 0)) {
    codeOffset((Vdbe *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28
              );
  }
  iVar3 = **(int **)(in_RSI + 0x20);
  if (*(int *)((long)&in_R9->zErrMsg + 4) == 0) {
    if (in_RCX != (long *)0x0) {
      local_60 = *(int *)*in_RCX;
      if ((*(byte *)((long)in_RCX + 0x24) & 1) == 0) {
        local_60 = local_60 + 1;
      }
      in_RDI->nMem = local_60 + in_RDI->nMem;
    }
    *(int *)((long)&in_R9->zErrMsg + 4) = in_RDI->nMem + 1;
    in_RDI->nMem = iVar3 + in_RDI->nMem;
  }
  else if (in_RDI->nMem < *(int *)((long)&in_R9->zErrMsg + 4) + iVar3) {
    in_RDI->nMem = iVar3 + in_RDI->nMem;
  }
  *(int *)&in_R9->pVdbe = iVar3;
  uVar1 = *(undefined4 *)((long)&in_R9->zErrMsg + 4);
  if (in_EDX < 0) {
    if (regData != 3) {
      if (((regData == 10) || (regData == 9)) || (regData == 0xd)) {
        local_69 = 1;
      }
      else {
        local_69 = 0;
      }
      if (((in_RCX != (long *)0x0) && (uVar6 == 0)) && ((regData != 0xc && (regData != 0xe)))) {
        local_69 = local_69 | 0xc;
        for (iVar7 = (int)in_RCX[1]; iVar7 < *(int *)*in_RCX; iVar7 = iVar7 + 1) {
          uVar2 = (uint)*(ushort *)(*in_RCX + (long)iVar7 * 0x18 + 0x1c);
          if (uVar2 != 0) {
            *(short *)(*(long *)(in_RSI + 0x20) + (long)(int)(uVar2 - 1) * 0x18 + 0x1c) =
                 ((short)iVar7 + 1) - (short)(int)in_RCX[1];
          }
        }
        for (iVar7 = 0; iVar7 < **(int **)(in_RSI + 0x20); iVar7 = iVar7 + 1) {
          if ((short)(*(int **)(in_RSI + 0x20))[(long)iVar7 * 6 + 7] != 0) {
            iVar3 = iVar3 + -1;
          }
        }
      }
      local_10._0_5_ = CONCAT14(local_69,uVar1);
      if (((*(int *)(in_RSI + 8) == 0) || ((local_69 & 8) == 0)) || (local_60 < 1)) {
        innerLoopLoadRow(in_stack_ffffffffffffff30,
                         (Select *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         (RowLoadInfo *)0x1eda3d);
      }
      else {
        in_RCX[5] = (long)&local_10;
      }
    }
  }
  else {
    for (iVar7 = 0; iVar7 < iVar3; iVar7 = iVar7 + 1) {
      sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                        (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                        (int)in_stack_ffffffffffffff40,eTnctType,in_stack_ffffffffffffff38);
    }
  }
  if (uVar6 != 0) {
    codeDistinct((Parse *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                 (ExprList *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 in_stack_ffffffffffffff54);
    fixDistinctOpenEph(in_stack_ffffffffffffff40,eTnctType,in_stack_ffffffffffffff38,
                       (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    if (in_RCX == (long *)0x0) {
      codeOffset((Vdbe *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                 in_stack_ffffffffffffff28);
    }
  }
  pParse_00 = (Parse *)(ulong)(regData - 1);
  iVar8 = (int)in_RCX;
  switch(pParse_00) {
  case (Parse *)0x0:
    iVar4 = sqlite3GetTempReg(in_RDI);
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                      (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),(int)in_stack_ffffffffffffff40
                      ,eTnctType,in_stack_ffffffffffffff38);
    sqlite3VdbeAddOp4Int
              ((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
               (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),(int)in_stack_ffffffffffffff40,
               eTnctType,in_stack_ffffffffffffff38,(int)((ulong)pParse_00 >> 0x20));
    sqlite3ReleaseTempReg(in_RDI,iVar4);
    break;
  case (Parse *)0x1:
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                      (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),(int)in_stack_ffffffffffffff40
                      ,eTnctType,in_stack_ffffffffffffff38);
    break;
  case (Parse *)0x2:
    sqlite3VdbeAddOp2((Vdbe *)pParse_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
    break;
  default:
    break;
  case (Parse *)0x4:
  case (Parse *)0x7:
  case (Parse *)0xb:
  case (Parse *)0xd:
    sqlite3GetTempRange((Parse *)CONCAT44(eTnctType,in_stack_ffffffffffffff38),0);
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                      (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),(int)in_stack_ffffffffffffff40
                      ,eTnctType,in_stack_ffffffffffffff38);
    if (regData == 5) {
      sqlite3VdbeCurrentAddr(p_00);
      sqlite3VdbeAddOp4Int
                ((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),(int)in_stack_ffffffffffffff40,
                 eTnctType,in_stack_ffffffffffffff38,(int)((ulong)pParse_00 >> 0x20));
      sqlite3VdbeAddOp4Int
                ((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),(int)in_stack_ffffffffffffff40,
                 eTnctType,in_stack_ffffffffffffff38,(int)((ulong)pParse_00 >> 0x20));
    }
    if (in_RCX == (long *)0x0) {
      iVar4 = sqlite3GetTempReg(in_RDI);
      sqlite3VdbeAddOp2((Vdbe *)pParse_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
      sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                        (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                        (int)in_stack_ffffffffffffff40,eTnctType,in_stack_ffffffffffffff38);
      sqlite3VdbeChangeP5(p_00,8);
      sqlite3ReleaseTempReg(in_RDI,iVar4);
    }
    else {
      pushOntoSorter(in_R9,(SortCtx *)p_00,(Select *)CONCAT44(iVar7,uVar6),regData,iVar4,iVar3,
                     (int)in_RCX);
      in_stack_ffffffffffffff28 = local_60;
    }
    sqlite3ReleaseTempRange(pParse_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    break;
  case (Parse *)0x5:
  case (Parse *)0x6:
    iVar3 = 0;
    piVar5 = *(int **)&in_R9->isMultiWrite;
    iVar4 = *piVar5;
    iVar7 = sqlite3GetTempReg(in_RDI);
    sqlite3GetTempRange((Parse *)CONCAT44(eTnctType,in_stack_ffffffffffffff38),
                        (int)((ulong)pParse_00 >> 0x20));
    if (regData == 6) {
      iVar3 = sqlite3VdbeAddOp4Int
                        ((Vdbe *)CONCAT44(iVar3,in_stack_ffffffffffffff48),
                         (int)((ulong)piVar5 >> 0x20),(int)piVar5,eTnctType,
                         in_stack_ffffffffffffff38,(int)((ulong)pParse_00 >> 0x20));
    }
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(iVar3,in_stack_ffffffffffffff48),(int)((ulong)piVar5 >> 0x20)
                      ,(int)piVar5,eTnctType,in_stack_ffffffffffffff38);
    if (regData == 6) {
      sqlite3VdbeAddOp2((Vdbe *)pParse_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
      sqlite3VdbeChangeP5(p_00,0x10);
    }
    for (iVar8 = 0; iVar8 < iVar4; iVar8 = iVar8 + 1) {
      sqlite3VdbeAddOp2((Vdbe *)pParse_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
    }
    sqlite3VdbeAddOp2((Vdbe *)pParse_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(iVar3,in_stack_ffffffffffffff48),(int)((ulong)piVar5 >> 0x20)
                      ,(int)piVar5,eTnctType,in_stack_ffffffffffffff38);
    sqlite3VdbeAddOp4Int
              ((Vdbe *)CONCAT44(iVar3,in_stack_ffffffffffffff48),(int)((ulong)piVar5 >> 0x20),
               (int)piVar5,eTnctType,in_stack_ffffffffffffff38,(int)((ulong)pParse_00 >> 0x20));
    if (iVar3 != 0) {
      sqlite3VdbeJumpHere((Vdbe *)pParse_00,in_stack_ffffffffffffff2c);
    }
    sqlite3ReleaseTempReg(in_RDI,iVar7);
    sqlite3ReleaseTempRange(pParse_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    break;
  case (Parse *)0x8:
  case (Parse *)0xc:
    if (in_RCX == (long *)0x0) {
      if (regData == 0xd) {
        sqlite3VdbeAddOp1((Vdbe *)pParse_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
      }
      else {
        sqlite3VdbeAddOp2((Vdbe *)pParse_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
      }
    }
    else {
      pushOntoSorter(in_R9,(SortCtx *)p_00,(Select *)CONCAT44(iVar7,uVar6),regData,iVar4,iVar3,iVar8
                    );
      in_stack_ffffffffffffff28 = local_60;
    }
    break;
  case (Parse *)0x9:
    if (in_RCX != (long *)0x0) {
      pushOntoSorter(in_R9,(SortCtx *)p_00,(Select *)CONCAT44(iVar7,uVar6),regData,iVar4,iVar3,iVar8
                    );
      in_stack_ffffffffffffff28 = local_60;
    }
    break;
  case (Parse *)0xa:
    if (in_RCX == (long *)0x0) {
      iVar4 = sqlite3GetTempReg(in_RDI);
      sqlite3VdbeAddOp4((Vdbe *)in_stack_ffffffffffffff40,eTnctType,in_stack_ffffffffffffff38,
                        (int)((ulong)pParse_00 >> 0x20),(int)pParse_00,
                        (char *)CONCAT44(in_stack_ffffffffffffff2c,iVar3),in_stack_ffffffffffffff50)
      ;
      sqlite3VdbeAddOp4Int
                ((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),(int)in_stack_ffffffffffffff40,
                 eTnctType,in_stack_ffffffffffffff38,(int)((ulong)pParse_00 >> 0x20));
      if (*(int *)&in_R9->zErrMsg != 0) {
        sqlite3VdbeAddOp4Int
                  ((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),(int)in_stack_ffffffffffffff40,
                   eTnctType,in_stack_ffffffffffffff38,(int)((ulong)pParse_00 >> 0x20));
        sqlite3VdbeExplain(in_RDI,'\0',"CREATE BLOOM FILTER");
      }
      sqlite3ReleaseTempReg(in_RDI,iVar4);
      in_stack_ffffffffffffff28 = iVar3;
    }
    else {
      pushOntoSorter(in_R9,(SortCtx *)p_00,(Select *)CONCAT44(iVar7,uVar6),regData,iVar4,iVar3,iVar8
                    );
      *(undefined4 *)&in_R9->zErrMsg = 0;
      in_stack_ffffffffffffff28 = local_60;
    }
    break;
  case (Parse *)0xe:
    if (in_RCX == (long *)0x0) {
      iVar4 = *(int *)&in_R9->zErrMsg;
      sqlite3GetTempReg(in_RDI);
      sqlite3VdbeAddOp2((Vdbe *)pParse_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
      sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                        (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                        (int)in_stack_ffffffffffffff40,eTnctType,in_stack_ffffffffffffff38);
      iVar7 = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20);
      if (iVar4 < 0) {
        sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                          iVar7,(int)in_stack_ffffffffffffff40,eTnctType,in_stack_ffffffffffffff38);
      }
      else {
        sqlite3VdbeAddOp4Int
                  ((Vdbe *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),iVar7,
                   (int)in_stack_ffffffffffffff40,eTnctType,in_stack_ffffffffffffff38,
                   (int)((ulong)pParse_00 >> 0x20));
      }
    }
    else {
      pushOntoSorter(in_R9,(SortCtx *)p_00,(Select *)CONCAT44(iVar7,uVar6),regData,iVar4,iVar3,iVar8
                    );
      in_stack_ffffffffffffff28 = local_60;
    }
  }
  if ((in_RCX == (long *)0x0) && (*(int *)(in_RSI + 8) != 0)) {
    sqlite3VdbeAddOp2((Vdbe *)pParse_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void selectInnerLoop(
  Parse *pParse,          /* The parser context */
  Select *p,              /* The complete select statement being coded */
  int srcTab,             /* Pull data from this table if non-negative */
  SortCtx *pSort,         /* If not NULL, info on how to process ORDER BY */
  DistinctCtx *pDistinct, /* If not NULL, info on how to process DISTINCT */
  SelectDest *pDest,      /* How to dispose of the results */
  int iContinue,          /* Jump here to continue with next row */
  int iBreak              /* Jump here to break out of the inner loop */
){
  Vdbe *v = pParse->pVdbe;
  int i;
  int hasDistinct;            /* True if the DISTINCT keyword is present */
  int eDest = pDest->eDest;   /* How to dispose of results */
  int iParm = pDest->iSDParm; /* First argument to disposal method */
  int nResultCol;             /* Number of result columns */
  int nPrefixReg = 0;         /* Number of extra registers before regResult */
  RowLoadInfo sRowLoadInfo;   /* Info for deferred row loading */

  /* Usually, regResult is the first cell in an array of memory cells
  ** containing the current result row. In this case regOrig is set to the
  ** same value. However, if the results are being sent to the sorter, the
  ** values for any expressions that are also part of the sort-key are omitted
  ** from this array. In this case regOrig is set to zero.  */
  int regResult;              /* Start of memory holding current results */
  int regOrig;                /* Start of memory holding full result (or 0) */

  assert( v );
  assert( p->pEList!=0 );
  hasDistinct = pDistinct ? pDistinct->eTnctType : WHERE_DISTINCT_NOOP;
  if( pSort && pSort->pOrderBy==0 ) pSort = 0;
  if( pSort==0 && !hasDistinct ){
    assert( iContinue!=0 );
    codeOffset(v, p->iOffset, iContinue);
  }

  /* Pull the requested columns.
  */
  nResultCol = p->pEList->nExpr;

  if( pDest->iSdst==0 ){
    if( pSort ){
      nPrefixReg = pSort->pOrderBy->nExpr;
      if( !(pSort->sortFlags & SORTFLAG_UseSorter) ) nPrefixReg++;
      pParse->nMem += nPrefixReg;
    }
    pDest->iSdst = pParse->nMem+1;
    pParse->nMem += nResultCol;
  }else if( pDest->iSdst+nResultCol > pParse->nMem ){
    /* This is an error condition that can result, for example, when a SELECT
    ** on the right-hand side of an INSERT contains more result columns than
    ** there are columns in the table on the left.  The error will be caught
    ** and reported later.  But we need to make sure enough memory is allocated
    ** to avoid other spurious errors in the meantime. */
    pParse->nMem += nResultCol;
  }
  pDest->nSdst = nResultCol;
  regOrig = regResult = pDest->iSdst;
  if( srcTab>=0 ){
    for(i=0; i<nResultCol; i++){
      sqlite3VdbeAddOp3(v, OP_Column, srcTab, i, regResult+i);
      VdbeComment((v, "%s", p->pEList->a[i].zEName));
    }
  }else if( eDest!=SRT_Exists ){
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    ExprList *pExtra = 0;
#endif
    /* If the destination is an EXISTS(...) expression, the actual
    ** values returned by the SELECT are not required.
    */
    u8 ecelFlags;    /* "ecel" is an abbreviation of "ExprCodeExprList" */
    ExprList *pEList;
    if( eDest==SRT_Mem || eDest==SRT_Output || eDest==SRT_Coroutine ){
      ecelFlags = SQLITE_ECEL_DUP;
    }else{
      ecelFlags = 0;
    }
    if( pSort && hasDistinct==0 && eDest!=SRT_EphemTab && eDest!=SRT_Table ){
      /* For each expression in p->pEList that is a copy of an expression in
      ** the ORDER BY clause (pSort->pOrderBy), set the associated
      ** iOrderByCol value to one more than the index of the ORDER BY
      ** expression within the sort-key that pushOntoSorter() will generate.
      ** This allows the p->pEList field to be omitted from the sorted record,
      ** saving space and CPU cycles.  */
      ecelFlags |= (SQLITE_ECEL_OMITREF|SQLITE_ECEL_REF);

      for(i=pSort->nOBSat; i<pSort->pOrderBy->nExpr; i++){
        int j;
        if( (j = pSort->pOrderBy->a[i].u.x.iOrderByCol)>0 ){
          p->pEList->a[j-1].u.x.iOrderByCol = i+1-pSort->nOBSat;
        }
      }
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
      selectExprDefer(pParse, pSort, p->pEList, &pExtra);
      if( pExtra && pParse->db->mallocFailed==0 ){
        /* If there are any extra PK columns to add to the sorter records,
        ** allocate extra memory cells and adjust the OpenEphemeral
        ** instruction to account for the larger records. This is only
        ** required if there are one or more WITHOUT ROWID tables with
        ** composite primary keys in the SortCtx.aDefer[] array.  */
        VdbeOp *pOp = sqlite3VdbeGetOp(v, pSort->addrSortIndex);
        pOp->p2 += (pExtra->nExpr - pSort->nDefer);
        pOp->p4.pKeyInfo->nAllField += (pExtra->nExpr - pSort->nDefer);
        pParse->nMem += pExtra->nExpr;
      }
#endif

      /* Adjust nResultCol to account for columns that are omitted
      ** from the sorter by the optimizations in this branch */
      pEList = p->pEList;
      for(i=0; i<pEList->nExpr; i++){
        if( pEList->a[i].u.x.iOrderByCol>0
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
         || pEList->a[i].fg.bSorterRef
#endif
        ){
          nResultCol--;
          regOrig = 0;
        }
      }

      testcase( regOrig );
      testcase( eDest==SRT_Set );
      testcase( eDest==SRT_Mem );
      testcase( eDest==SRT_Coroutine );
      testcase( eDest==SRT_Output );
      assert( eDest==SRT_Set || eDest==SRT_Mem
           || eDest==SRT_Coroutine || eDest==SRT_Output
           || eDest==SRT_Upfrom );
    }
    sRowLoadInfo.regResult = regResult;
    sRowLoadInfo.ecelFlags = ecelFlags;
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    sRowLoadInfo.pExtra = pExtra;
    sRowLoadInfo.regExtraResult = regResult + nResultCol;
    if( pExtra ) nResultCol += pExtra->nExpr;
#endif
    if( p->iLimit
     && (ecelFlags & SQLITE_ECEL_OMITREF)!=0
     && nPrefixReg>0
    ){
      assert( pSort!=0 );
      assert( hasDistinct==0 );
      pSort->pDeferredRowLoad = &sRowLoadInfo;
      regOrig = 0;
    }else{
      innerLoopLoadRow(pParse, p, &sRowLoadInfo);
    }
  }

  /* If the DISTINCT keyword was present on the SELECT statement
  ** and this row has been seen before, then do not make this row
  ** part of the result.
  */
  if( hasDistinct ){
    int eType = pDistinct->eTnctType;
    int iTab = pDistinct->tabTnct;
    assert( nResultCol==p->pEList->nExpr );
    iTab = codeDistinct(pParse, eType, iTab, iContinue, p->pEList, regResult);
    fixDistinctOpenEph(pParse, eType, iTab, pDistinct->addrTnct);
    if( pSort==0 ){
      codeOffset(v, p->iOffset, iContinue);
    }
  }

  switch( eDest ){
    /* In this mode, write each query result to the key of the temporary
    ** table iParm.
    */
#ifndef SQLITE_OMIT_COMPOUND_SELECT
    case SRT_Union: {
      int r1;
      r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nResultCol, r1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, regResult, nResultCol);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

    /* Construct a record from the query result, but instead of
    ** saving that record, use it as a key to delete elements from
    ** the temporary table iParm.
    */
    case SRT_Except: {
      sqlite3VdbeAddOp3(v, OP_IdxDelete, iParm, regResult, nResultCol);
      break;
    }
#endif /* SQLITE_OMIT_COMPOUND_SELECT */

    /* Store the result as data using a unique key.
    */
    case SRT_Fifo:
    case SRT_DistFifo:
    case SRT_Table:
    case SRT_EphemTab: {
      int r1 = sqlite3GetTempRange(pParse, nPrefixReg+1);
      testcase( eDest==SRT_Table );
      testcase( eDest==SRT_EphemTab );
      testcase( eDest==SRT_Fifo );
      testcase( eDest==SRT_DistFifo );
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nResultCol, r1+nPrefixReg);
#if !defined(SQLITE_ENABLE_NULL_TRIM) && defined(SQLITE_DEBUG)
      /* A destination of SRT_Table and a non-zero iSDParm2 parameter means
      ** that this is an "UPDATE ... FROM" on a virtual table or view. In this
      ** case set the p5 parameter of the OP_MakeRecord to OPFLAG_NOCHNG_MAGIC.
      ** This does not affect operation in any way - it just allows MakeRecord
      ** to process OPFLAG_NOCHANGE values without an assert() failing. */
      if( eDest==SRT_Table && pDest->iSDParm2 ){
        sqlite3VdbeChangeP5(v, OPFLAG_NOCHNG_MAGIC);
      }
#endif
#ifndef SQLITE_OMIT_CTE
      if( eDest==SRT_DistFifo ){
        /* If the destination is DistFifo, then cursor (iParm+1) is open
        ** on an ephemeral index. If the current row is already present
        ** in the index, do not write it to the output. If not, add the
        ** current row to the index and proceed with writing it to the
        ** output table as well.  */
        int addr = sqlite3VdbeCurrentAddr(v) + 4;
        sqlite3VdbeAddOp4Int(v, OP_Found, iParm+1, addr, r1, 0);
        VdbeCoverage(v);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm+1, r1,regResult,nResultCol);
        assert( pSort==0 );
      }
#endif
      if( pSort ){
        assert( regResult==regOrig );
        pushOntoSorter(pParse, pSort, p, r1+nPrefixReg, regOrig, 1, nPrefixReg);
      }else{
        int r2 = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp2(v, OP_NewRowid, iParm, r2);
        sqlite3VdbeAddOp3(v, OP_Insert, iParm, r1, r2);
        sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
        sqlite3ReleaseTempReg(pParse, r2);
      }
      sqlite3ReleaseTempRange(pParse, r1, nPrefixReg+1);
      break;
    }

    case SRT_Upfrom: {
      if( pSort ){
        pushOntoSorter(
            pParse, pSort, p, regResult, regOrig, nResultCol, nPrefixReg);
      }else{
        int i2 = pDest->iSDParm2;
        int r1 = sqlite3GetTempReg(pParse);

        /* If the UPDATE FROM join is an aggregate that matches no rows, it
        ** might still be trying to return one row, because that is what
        ** aggregates do.  Don't record that empty row in the output table. */
        sqlite3VdbeAddOp2(v, OP_IsNull, regResult, iBreak); VdbeCoverage(v);

        sqlite3VdbeAddOp3(v, OP_MakeRecord,
                          regResult+(i2<0), nResultCol-(i2<0), r1);
        if( i2<0 ){
          sqlite3VdbeAddOp3(v, OP_Insert, iParm, r1, regResult);
        }else{
          sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, regResult, i2);
        }
      }
      break;
    }

#ifndef SQLITE_OMIT_SUBQUERY
    /* If we are creating a set for an "expr IN (SELECT ...)" construct,
    ** then there should be a single item on the stack.  Write this
    ** item into the set table with bogus data.
    */
    case SRT_Set: {
      if( pSort ){
        /* At first glance you would think we could optimize out the
        ** ORDER BY in this case since the order of entries in the set
        ** does not matter.  But there might be a LIMIT clause, in which
        ** case the order does matter */
        pushOntoSorter(
            pParse, pSort, p, regResult, regOrig, nResultCol, nPrefixReg);
        pDest->iSDParm2 = 0; /* Signal that any Bloom filter is unpopulated */
      }else{
        int r1 = sqlite3GetTempReg(pParse);
        assert( sqlite3Strlen30(pDest->zAffSdst)==nResultCol );
        sqlite3VdbeAddOp4(v, OP_MakeRecord, regResult, nResultCol,
            r1, pDest->zAffSdst, nResultCol);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, regResult, nResultCol);
        if( pDest->iSDParm2 ){
          sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pDest->iSDParm2, 0,
                               regResult, nResultCol);
          ExplainQueryPlan((pParse, 0, "CREATE BLOOM FILTER"));
        }
        sqlite3ReleaseTempReg(pParse, r1);
      }
      break;
    }


    /* If any row exist in the result set, record that fact and abort.
    */
    case SRT_Exists: {
      sqlite3VdbeAddOp2(v, OP_Integer, 1, iParm);
      /* The LIMIT clause will terminate the loop for us */
      break;
    }

    /* If this is a scalar select that is part of an expression, then
    ** store the results in the appropriate memory cell or array of
    ** memory cells and break out of the scan loop.
    */
    case SRT_Mem: {
      if( pSort ){
        assert( nResultCol<=pDest->nSdst );
        pushOntoSorter(
            pParse, pSort, p, regResult, regOrig, nResultCol, nPrefixReg);
      }else{
        assert( nResultCol==pDest->nSdst );
        assert( regResult==iParm );
        /* The LIMIT clause will jump out of the loop for us */
      }
      break;
    }
#endif /* #ifndef SQLITE_OMIT_SUBQUERY */

    case SRT_Coroutine:       /* Send data to a co-routine */
    case SRT_Output: {        /* Return the results */
      testcase( eDest==SRT_Coroutine );
      testcase( eDest==SRT_Output );
      if( pSort ){
        pushOntoSorter(pParse, pSort, p, regResult, regOrig, nResultCol,
                       nPrefixReg);
      }else if( eDest==SRT_Coroutine ){
        sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      }else{
        sqlite3VdbeAddOp2(v, OP_ResultRow, regResult, nResultCol);
      }
      break;
    }

#ifndef SQLITE_OMIT_CTE
    /* Write the results into a priority queue that is order according to
    ** pDest->pOrderBy (in pSO).  pDest->iSDParm (in iParm) is the cursor for an
    ** index with pSO->nExpr+2 columns.  Build a key using pSO for the first
    ** pSO->nExpr columns, then make sure all keys are unique by adding a
    ** final OP_Sequence column.  The last column is the record as a blob.
    */
    case SRT_DistQueue:
    case SRT_Queue: {
      int nKey;
      int r1, r2, r3;
      int addrTest = 0;
      ExprList *pSO;
      pSO = pDest->pOrderBy;
      assert( pSO );
      nKey = pSO->nExpr;
      r1 = sqlite3GetTempReg(pParse);
      r2 = sqlite3GetTempRange(pParse, nKey+2);
      r3 = r2+nKey+1;
      if( eDest==SRT_DistQueue ){
        /* If the destination is DistQueue, then cursor (iParm+1) is open
        ** on a second ephemeral index that holds all values every previously
        ** added to the queue. */
        addrTest = sqlite3VdbeAddOp4Int(v, OP_Found, iParm+1, 0,
                                        regResult, nResultCol);
        VdbeCoverage(v);
      }
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regResult, nResultCol, r3);
      if( eDest==SRT_DistQueue ){
        sqlite3VdbeAddOp2(v, OP_IdxInsert, iParm+1, r3);
        sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
      }
      for(i=0; i<nKey; i++){
        sqlite3VdbeAddOp2(v, OP_SCopy,
                          regResult + pSO->a[i].u.x.iOrderByCol - 1,
                          r2+i);
      }
      sqlite3VdbeAddOp2(v, OP_Sequence, iParm, r2+nKey);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, r2, nKey+2, r1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iParm, r1, r2, nKey+2);
      if( addrTest ) sqlite3VdbeJumpHere(v, addrTest);
      sqlite3ReleaseTempReg(pParse, r1);
      sqlite3ReleaseTempRange(pParse, r2, nKey+2);
      break;
    }
#endif /* SQLITE_OMIT_CTE */



#if !defined(SQLITE_OMIT_TRIGGER)
    /* Discard the results.  This is used for SELECT statements inside
    ** the body of a TRIGGER.  The purpose of such selects is to call
    ** user-defined functions that have side effects.  We do not care
    ** about the actual results of the select.
    */
    default: {
      assert( eDest==SRT_Discard );
      break;
    }
#endif
  }

  /* Jump to the end of the loop if the LIMIT is reached.  Except, if
  ** there is a sorter, in which case the sorter has already limited
  ** the output for us.
  */
  if( pSort==0 && p->iLimit ){
    sqlite3VdbeAddOp2(v, OP_DecrJumpZero, p->iLimit, iBreak); VdbeCoverage(v);
  }
}